

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O1

NanoVDBMediumProvider *
pbrt::NanoVDBMediumProvider::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  size_t *psVar1;
  size_t *psVar2;
  float *pfVar3;
  double dVar4;
  double dVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint8_t *puVar12;
  undefined1 auVar14 [12];
  undefined1 auVar13 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar16 [12];
  undefined1 auVar15 [16];
  undefined1 in_ZMM3 [64];
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  Allocator alloc_local;
  GridHandle<pbrt::NanoVDBBuffer> temperatureGrid;
  GridHandle<pbrt::NanoVDBBuffer> densityGrid;
  Float temperatureScale;
  Float temperatureCutoff;
  Float LeScale;
  Bounds3f bounds;
  string filename;
  
  auVar16 = in_ZMM3._4_12_;
  auVar14 = in_ZMM1._4_12_;
  psVar1 = &densityGrid.mBuffer.bytesAllocated;
  alloc_local = alloc;
  densityGrid.super_GridHandleBase._vptr_GridHandleBase = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&densityGrid,"filename","");
  psVar2 = &temperatureGrid.mBuffer.bytesAllocated;
  temperatureGrid.super_GridHandleBase._vptr_GridHandleBase = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&temperatureGrid,"");
  ParameterDictionary::GetOneString
            (&filename,parameters,(string *)&densityGrid,(string *)&temperatureGrid);
  if (temperatureGrid.super_GridHandleBase._vptr_GridHandleBase != (_func_int **)psVar2) {
    operator_delete(temperatureGrid.super_GridHandleBase._vptr_GridHandleBase,
                    temperatureGrid.mBuffer.bytesAllocated + 1);
  }
  if (densityGrid.super_GridHandleBase._vptr_GridHandleBase != (_func_int **)psVar1) {
    operator_delete(densityGrid.super_GridHandleBase._vptr_GridHandleBase,
                    densityGrid.mBuffer.bytesAllocated + 1);
  }
  if (filename._M_string_length != 0) {
    densityGrid.super_GridHandleBase._vptr_GridHandleBase = (_func_int **)&PTR__GridHandle_0315d2b0;
    densityGrid.mBuffer.alloc.memoryResource = pstd::pmr::new_delete_resource();
    densityGrid.mBuffer.bytesAllocated = 0;
    densityGrid.mBuffer.ptr = (uint8_t *)0x0;
    local_108._0_8_ = &local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"density","");
    readGrid<pbrt::NanoVDBBuffer>(&temperatureGrid,&filename,(string *)local_108,loc,alloc_local);
    NanoVDBBuffer::operator=(&densityGrid.mBuffer,&temperatureGrid.mBuffer);
    nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle(&temperatureGrid);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._0_8_ != &local_f8) {
      operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
    }
    iVar11 = (*densityGrid.super_GridHandleBase._vptr_GridHandleBase[2])();
    if (CONCAT44(extraout_var,iVar11) != 0) {
      puVar12 = (uint8_t *)0x0;
      if (*(int *)(densityGrid.mBuffer.ptr + 0x24c) == 1) {
        puVar12 = densityGrid.mBuffer.ptr;
      }
      dVar4 = *(double *)(puVar12 + 0x118);
      auVar7 = *(undefined1 (*) [16])(puVar12 + 0x108);
      auVar8 = *(undefined1 (*) [16])(puVar12 + 0x120);
      dVar5 = *(double *)(puVar12 + 0x130);
      temperatureGrid.super_GridHandleBase._vptr_GridHandleBase =
           (_func_int **)&PTR__GridHandle_0315d2b0;
      temperatureGrid.mBuffer.alloc.memoryResource = pstd::pmr::new_delete_resource();
      temperatureGrid.mBuffer.bytesAllocated = 0;
      temperatureGrid.mBuffer.ptr = (uint8_t *)0x0;
      pfVar3 = &bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
      bounds.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = pfVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&bounds,"temperature","");
      readGrid<pbrt::NanoVDBBuffer>
                ((GridHandle<pbrt::NanoVDBBuffer> *)local_108,&filename,(string *)&bounds,loc,
                 alloc_local);
      NanoVDBBuffer::operator=(&temperatureGrid.mBuffer,(NanoVDBBuffer *)(local_108 + 8));
      nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle
                ((GridHandle<pbrt::NanoVDBBuffer> *)local_108);
      if ((float *)bounds.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ != pfVar3) {
        operator_delete((void *)bounds.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_,
                        CONCAT44(bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z,
                                 bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y) + 1);
      }
      auVar7 = vcvtpd2ps_avx(auVar7);
      auVar13._0_4_ = (float)dVar4;
      auVar13._4_12_ = auVar14;
      auVar8 = vcvtpd2ps_avx(auVar8);
      auVar15._0_4_ = (float)dVar5;
      auVar15._4_12_ = auVar16;
      auVar9 = vminps_avx(auVar8,auVar7);
      auVar10 = vminss_avx(auVar15,auVar13);
      bounds.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar9);
      bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = auVar10._0_4_;
      auVar8 = vmaxps_avx(auVar8,auVar7);
      auVar7 = vmaxss_avx(auVar15,auVar13);
      uVar6 = vmovlps_avx(auVar8);
      bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar6;
      bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar6 >> 0x20);
      bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = auVar7._0_4_;
      local_108._0_8_ = &local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"LeScale","");
      LeScale = ParameterDictionary::GetOneFloat(parameters,(string *)local_108,1.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._0_8_ != &local_f8) {
        operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
      }
      local_108._0_8_ = &local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"temperaturecutoff","");
      temperatureCutoff = ParameterDictionary::GetOneFloat(parameters,(string *)local_108,0.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._0_8_ != &local_f8) {
        operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
      }
      local_108._0_8_ = &local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"temperaturescale","");
      temperatureScale = ParameterDictionary::GetOneFloat(parameters,(string *)local_108,1.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._0_8_ != &local_f8) {
        operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
      }
      iVar11 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                         (alloc_local.memoryResource,0x78,8);
      pstd::pmr::polymorphic_allocator<std::byte>::
      construct<pbrt::NanoVDBMediumProvider,pbrt::Bounds3<float>&,nanovdb::GridHandle<pbrt::NanoVDBBuffer>,nanovdb::GridHandle<pbrt::NanoVDBBuffer>,float&,float&,float&>
                (&alloc_local,(NanoVDBMediumProvider *)CONCAT44(extraout_var_00,iVar11),&bounds,
                 &densityGrid,&temperatureGrid,&LeScale,&temperatureCutoff,&temperatureScale);
      nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle(&temperatureGrid);
      nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle(&densityGrid);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename._M_dataplus._M_p != &filename.field_2) {
        operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
      }
      return (NanoVDBMediumProvider *)CONCAT44(extraout_var_00,iVar11);
    }
    ErrorExit<std::__cxx11::string&>(loc,"%s: didn\'t find \"density\" grid.",&filename);
  }
  ErrorExit(loc,"Must supply \"filename\" to \"nanovdb\" medium.");
}

Assistant:

NanoVDBMediumProvider *NanoVDBMediumProvider::Create(
    const ParameterDictionary &parameters, const FileLoc *loc, Allocator alloc) {
    std::string filename = parameters.GetOneString("filename", "");
    if (filename.empty())
        ErrorExit(loc, "Must supply \"filename\" to \"nanovdb\" medium.");

    nanovdb::GridHandle<NanoVDBBuffer> densityGrid;
    nanovdb::BBox<nanovdb::Vec3R> bbox;
    densityGrid = readGrid<NanoVDBBuffer>(filename, "density", loc, alloc);
    if (!densityGrid)
        ErrorExit(loc, "%s: didn't find \"density\" grid.", filename);

    bbox = densityGrid.grid<float>()->worldBBox();

    nanovdb::GridHandle<NanoVDBBuffer> temperatureGrid;
    temperatureGrid = readGrid<NanoVDBBuffer>(filename, "temperature", loc, alloc);

    Bounds3f bounds(Point3f(bbox.min()[0], bbox.min()[1], bbox.min()[2]),
                    Point3f(bbox.max()[0], bbox.max()[1], bbox.max()[2]));

    Float LeScale = parameters.GetOneFloat("LeScale", 1.f);
    Float temperatureCutoff = parameters.GetOneFloat("temperaturecutoff", 0.f);
    Float temperatureScale = parameters.GetOneFloat("temperaturescale", 1.f);

    return alloc.new_object<NanoVDBMediumProvider>(bounds, std::move(densityGrid),
                                                   std::move(temperatureGrid), LeScale,
                                                   temperatureCutoff, temperatureScale);
}